

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_ext.hpp
# Opt level: O2

void detail::for_each_type<$4f154ab3$>::execute(string *paramName)

{
  bool bVar1;
  SourceLineInfo local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  SectionInfo local_100;
  Section local_b0;
  
  local_150.file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/test/include/catch_ext.hpp"
  ;
  local_150.line = 0x31;
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paramName,"=")
  ;
  std::operator+(&local_140,&local_120,
                 "N6custom19AllocatorDescriptorISt17integral_constantIbLb0EES1_IbLb1EES2_S3_S2_EE");
  Catch::SectionInfo::SectionInfo(&local_100,&local_150,&local_140);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    ____C_A_T_C_H____T_E_S_T___E_X_T_E_N_S_I_O_N____64<custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>
    ::execute();
  }
  Catch::Section::~Section(&local_b0);
  for_each_type<$5e065373$>::execute(paramName);
  return;
}

Assistant:

static void execute(const std::string& paramName)
  {

    SECTION(paramName + "=" + typeid(T).name()) { Func<T>::execute(); }
    for_each_type<Func, Ts...>::execute(paramName);
  }